

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_string_cursor_to_index(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp offset)

{
  undefined1 auVar1 [16];
  long len;
  sexp psVar2;
  sexp_uint_t sVar3;
  
  auVar1._8_8_ = (long)offset >> 0x3f;
  auVar1._0_8_ = (ulong)offset & 0xfffffffffffffffd;
  len = SUB168(auVar1 / SEXT816(8),0);
  if ((((ulong)str & 3) != 0) || (str->tag != 9)) {
    psVar2 = sexp_type_exception(ctx,self,9,str);
    return psVar2;
  }
  if (((uint)offset & 7) != 2) {
    psVar2 = sexp_type_exception(ctx,self,0xf,offset);
    return psVar2;
  }
  if ((-8 < (long)((ulong)offset & 0xfffffffffffffffd)) && (len <= (str->value).uvector.length)) {
    sVar3 = sexp_string_utf8_length
                      ((uchar *)((((str->value).type.cpl)->value).flonum_bits +
                                (long)(((str->value).type.name)->value).flonum_bits),len);
    return (sexp)(sVar3 * 2 + 1);
  }
  psVar2 = sexp_user_exception(ctx,self,"string-cursor->index: offset out of range",offset);
  return psVar2;
}

Assistant:

sexp sexp_string_cursor_to_index (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp offset) {
  sexp_sint_t off = sexp_unbox_string_cursor(offset);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, offset);
  if (off < 0 || off > (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-cursor->index: offset out of range", offset);
#if SEXP_USE_STRING_REF_CACHE
  sexp_uint_t cached_idx = sexp_cached_char_idx(str);
  sexp_sint_t cached_off = sexp_unbox_string_cursor(sexp_cached_cursor(str));
  unsigned char* string_data = (unsigned char*)sexp_string_data(str);
  sexp_sint_t idx_delta;
  if (off >= cached_off) {
    idx_delta = sexp_string_utf8_length(string_data+cached_off, off-cached_off);
  } else {
    idx_delta = 0 - sexp_string_utf8_length(string_data+off, cached_off-off);
  }

  sexp_uint_t new_idx = cached_idx + idx_delta;
  sexp_cached_char_idx(str) = new_idx;
  sexp_cached_cursor(str) = offset;
  return sexp_make_fixnum(new_idx);
#else
  return sexp_make_fixnum(sexp_string_utf8_length((unsigned char*)sexp_string_data(str), off));
#endif
}